

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::EventExpressionSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != BinaryEventExpression) && (kind != ParenthesizedEventExpression)) &&
     (kind != SignalEventExpression)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool EventExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BinaryEventExpression:
        case SyntaxKind::ParenthesizedEventExpression:
        case SyntaxKind::SignalEventExpression:
            return true;
        default:
            return false;
    }
}